

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Secp256k1::SignWhitelistSecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *offline_pubkey,
          ByteData256 *online_privkey,ByteData256 *tweak_sum,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *online_keys,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *offline_keys,
          uint32_t whitelist_index)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  allocator<secp256k1_pubkey> *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  secp256k1_context *psVar2;
  bool bVar3;
  CfdException *pCVar4;
  size_t sVar5;
  size_type sVar6;
  size_type sVar7;
  uchar *puVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  anon_struct_64_1_898a9ca8 *paVar12;
  anon_struct_64_1_898a9ca8 *paVar13;
  uchar *summed_seckey;
  allocator local_24b9;
  string local_24b8;
  CfdSourceLocation local_2498;
  undefined1 local_247a;
  allocator local_2479;
  string local_2478;
  CfdSourceLocation local_2458;
  size_t local_2440;
  size_t outlen;
  size_t output_size;
  undefined1 local_2428 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  string local_2408;
  CfdSourceLocation local_23e8;
  undefined1 local_23ca;
  allocator local_23c9;
  string local_23c8;
  CfdSourceLocation local_23a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2378;
  undefined1 local_2360 [8];
  secp256k1_whitelist_signature signature;
  string local_330;
  CfdSourceLocation local_310;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_2e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *offline_data;
  string local_2d0;
  CfdSourceLocation local_2b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_298;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_280;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *online_data;
  size_t index;
  undefined1 local_268 [8];
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> offline_pubkeys;
  undefined1 local_248 [8];
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> online_pubkeys;
  string local_228;
  CfdSourceLocation local_208;
  undefined1 local_1f0 [8];
  secp256k1_pubkey_conflict offline_pubkey_secp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *offline_pubkey_data;
  int ret;
  CfdSourceLocation local_168;
  undefined1 local_14a;
  allocator local_149;
  string local_148;
  CfdSourceLocation local_128;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8;
  CfdSourceLocation local_a8;
  undefined1 local_8d;
  allocator local_79;
  string local_78;
  CfdSourceLocation local_58;
  secp256k1_context *local_40;
  secp256k1_context *context;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *online_keys_local;
  ByteData256 *tweak_sum_local;
  ByteData256 *online_privkey_local;
  ByteData *offline_pubkey_local;
  Secp256k1 *this_local;
  
  local_40 = (secp256k1_context *)this->secp256k1_context_;
  context = (secp256k1_context *)online_keys;
  online_keys_local = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)tweak_sum
  ;
  tweak_sum_local = online_privkey;
  online_privkey_local = (ByteData256 *)offline_pubkey;
  offline_pubkey_local = (ByteData *)this;
  this_local = (Secp256k1 *)__return_storage_ptr__;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x1fc;
    local_58.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<>(&local_58,"Secp256k1 context is NULL.");
    local_8d = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_78,"Secp256k1 context is NULL.",&local_79);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
    local_8d = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar5 = ByteData::GetDataSize(offline_pubkey);
  if (sVar5 != 0x21) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x201;
    local_a8.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<>(&local_a8,"Invalid Argument pubkey size.");
    local_ca = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_c8,"Invalid Pubkey size.",&local_c9);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_c8);
    local_ca = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::empty
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context);
  if (bVar3) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x206;
    local_e8.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<>(&local_e8,"Invalid Argument online_keys empty.");
    local_10a = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_108,"Empty online_keys.",&local_109);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_108);
    local_10a = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar6 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context);
  if (0x100 < sVar6) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x20b;
    local_128.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<>(&local_128,"Invalid Argument online_keys maximum over.");
    local_14a = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_148,"Invalid online_keys size over.",&local_149)
    ;
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_148);
    local_14a = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar6 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context);
  sVar7 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    (offline_keys);
  if (sVar6 != sVar7) {
    local_168.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_168.filename = local_168.filename + 1;
    local_168.line = 0x210;
    local_168.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<>(&local_168,"Invalid Argument online_keys length.");
    offline_pubkey_data._6_1_ = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&ret,"Unmatch keylist length.",
               (allocator *)((long)&offline_pubkey_data + 7));
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&ret);
    offline_pubkey_data._6_1_ = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            (offline_pubkey_secp.data + 0x38);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
                     (ByteData *)online_privkey_local);
  psVar2 = local_40;
  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_00);
  sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
  offline_pubkey_data._0_4_ =
       secp256k1_ec_pubkey_parse(psVar2,(secp256k1_pubkey *)local_1f0,puVar8,sVar6);
  if ((int)offline_pubkey_data != 1) {
    local_208.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_208.filename = local_208.filename + 1;
    local_208.line = 0x21d;
    local_208.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>(&local_208,"secp256k1_ec_pubkey_parse offline_pubkey Error.({})",
                       (int *)&offline_pubkey_data);
    online_pubkeys.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_228,"Secp256k1 offline_pubkey parse Error.",
               (allocator *)
               ((long)&online_pubkeys.
                       super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_228);
    online_pubkeys.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar6 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)context);
  this_01 = (allocator<secp256k1_pubkey> *)
            ((long)&offline_pubkeys.
                    super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<secp256k1_pubkey>::allocator(this_01);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248,sVar6,this_01)
  ;
  ::std::allocator<secp256k1_pubkey>::~allocator
            ((allocator<secp256k1_pubkey> *)
             ((long)&offline_pubkeys.
                     super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  sVar6 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    (offline_keys);
  ::std::allocator<secp256k1_pubkey>::allocator((allocator<secp256k1_pubkey> *)((long)&index + 7));
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_268,sVar6,
             (allocator<secp256k1_pubkey> *)((long)&index + 7));
  ::std::allocator<secp256k1_pubkey>::~allocator((allocator<secp256k1_pubkey> *)((long)&index + 7));
  online_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  while( true ) {
    pvVar1 = online_data;
    pvVar9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::size
                       ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
    psVar2 = local_40;
    if (pvVar9 <= pvVar1) break;
    pvVar10 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         context,(size_type)online_data);
    ByteData::GetBytes(&local_298,pvVar10);
    psVar2 = local_40;
    local_280 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_298;
    pvVar11 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::operator[]
                        ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248,
                         (size_type)online_data);
    puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_280);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_280);
    offline_pubkey_data._0_4_ =
         secp256k1_ec_pubkey_parse(psVar2,(secp256k1_pubkey *)pvVar11,puVar8,sVar6);
    if ((int)offline_pubkey_data != 1) {
      local_2b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                   ,0x2f);
      local_2b0.filename = local_2b0.filename + 1;
      local_2b0.line = 0x22d;
      local_2b0.funcname = "SignWhitelistSecp256k1Ec";
      logger::warn<unsigned_long&,int&>
                (&local_2b0,"secp256k1_ec_pubkey_parse onlines[{}] Error.({})",
                 (unsigned_long *)&online_data,(int *)&offline_pubkey_data);
      offline_data._6_1_ = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_2d0,"Secp256k1 onlines pubkey parse Error.",
                 (allocator *)((long)&offline_data + 7));
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_2d0);
      offline_data._6_1_ = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pvVar10 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (offline_keys,(size_type)online_data);
    ByteData::GetBytes(&local_2f8,pvVar10);
    psVar2 = local_40;
    local_2e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8;
    pvVar11 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::operator[]
                        ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_268,
                         (size_type)online_data);
    puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_2e0);
    sVar6 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_2e0);
    offline_pubkey_data._0_4_ =
         secp256k1_ec_pubkey_parse(psVar2,(secp256k1_pubkey *)pvVar11,puVar8,sVar6);
    if ((int)offline_pubkey_data != 1) {
      local_310.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                   ,0x2f);
      local_310.filename = local_310.filename + 1;
      local_310.line = 0x23a;
      local_310.funcname = "SignWhitelistSecp256k1Ec";
      logger::warn<unsigned_long&,int&>
                (&local_310,"secp256k1_ec_pubkey_parse offlines[{}] Error.({})",
                 (unsigned_long *)&online_data,(int *)&offline_pubkey_data);
      signature.data[0x201e] = '\x01';
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_330,"Secp256k1 offlines pubkey parse Error.",
                 (allocator *)(signature.data + 0x201f));
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_330);
      signature.data[0x201e] = '\0';
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2f8);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_298);
    online_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  ((long)&(online_data->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
  }
  paVar12 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::data
                      ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
  paVar13 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::data
                      ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_268);
  sVar6 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::size
                    ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
  ByteData256::GetBytes(&local_2378,tweak_sum_local);
  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2378);
  ByteData256::GetBytes(&local_2390,(ByteData256 *)online_keys_local);
  summed_seckey =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2390);
  offline_pubkey_data._0_4_ =
       secp256k1_whitelist_sign
                 (psVar2,(secp256k1_whitelist_signature *)local_2360,(secp256k1_pubkey *)paVar12,
                  (secp256k1_pubkey *)paVar13,sVar6,(secp256k1_pubkey *)local_1f0,puVar8,
                  summed_seckey,(ulong)whitelist_index,(secp256k1_nonce_function)0x0,(void *)0x0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2390);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2378);
  psVar2 = local_40;
  if ((int)offline_pubkey_data != 1) {
    local_23a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_23a8.filename = local_23a8.filename + 1;
    local_23a8.line = 0x249;
    local_23a8.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>(&local_23a8,"secp256k1_whitelist_sign Error.({})",(int *)&offline_pubkey_data
                      );
    local_23ca = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_23c8,"Secp256k1 whitelist sign Error.",&local_23c9);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_23c8);
    local_23ca = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  paVar12 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::data
                      ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
  paVar13 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::data
                      ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_268);
  sVar6 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::size
                    ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
  offline_pubkey_data._0_4_ =
       secp256k1_whitelist_verify
                 (psVar2,(secp256k1_whitelist_signature *)local_2360,(secp256k1_pubkey *)paVar12,
                  (secp256k1_pubkey *)paVar13,sVar6,(secp256k1_pubkey *)local_1f0);
  if ((int)offline_pubkey_data != 1) {
    local_23e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_23e8.filename = local_23e8.filename + 1;
    local_23e8.line = 0x252;
    local_23e8.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>(&local_23e8,"secp256k1_whitelist_verify Error.({})",
                       (int *)&offline_pubkey_data);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_2408,"Secp256k1 whitelist verify Error.",
               (allocator *)
               ((long)&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_2408);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&output_size + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2428,0x2021,
             (allocator<unsigned_char> *)((long)&output_size + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&output_size + 7));
  sVar6 = ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::size
                    ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
  psVar2 = local_40;
  local_2440 = sVar6 * 0x20 + 0x21;
  outlen = local_2440;
  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2428);
  offline_pubkey_data._0_4_ =
       secp256k1_whitelist_signature_serialize
                 (psVar2,puVar8,&local_2440,(secp256k1_whitelist_signature *)local_2360);
  if ((int)offline_pubkey_data != 1) {
    local_2458.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_2458.filename = local_2458.filename + 1;
    local_2458.line = 0x25f;
    local_2458.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>(&local_2458,"secp256k1_whitelist_signature_serialize Error.({})",
                       (int *)&offline_pubkey_data);
    local_247a = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_2478,"Secp256k1 whitelist signature serialize Error.",&local_2479);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_2478);
    local_247a = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_2440 != outlen) {
    local_2498.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_2498.filename = local_2498.filename + 1;
    local_2498.line = 0x267;
    local_2498.funcname = "SignWhitelistSecp256k1Ec";
    logger::warn<unsigned_long&>
              (&local_2498,"secp256k1_whitelist_signature_serialize size Error.({})",&local_2440);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_24b8,"Secp256k1 whitelist signature serialize size Error.",
               &local_24b9);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_24b8);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2428,outlen);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2428);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2428);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::~vector
            ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_268);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::~vector
            ((vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> *)local_248);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (offline_pubkey_secp.data + 0x38));
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::SignWhitelistSecp256k1Ec(
    const ByteData& offline_pubkey, const ByteData256& online_privkey,
    const ByteData256& tweak_sum, const std::vector<ByteData>& online_keys,
    const std::vector<ByteData>& offline_keys, uint32_t whitelist_index) {
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPrivkeySize = 32;
  static constexpr uint32_t kOutputMaxSize =
      1 + (kPrivkeySize * (1 + kWhitelistCountMaximum));
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (offline_pubkey.GetDataSize() != 33) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (online_keys.empty()) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty online_keys.");
  }
  if (online_keys.size() > kWhitelistCountMaximum) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys maximum over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid online_keys size over.");
  }
  if (online_keys.size() != offline_keys.size()) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys length.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch keylist length.");
  }

  int ret;
  const std::vector<uint8_t>& offline_pubkey_data = offline_pubkey.GetBytes();
  secp256k1_pubkey offline_pubkey_secp;
  ret = secp256k1_ec_pubkey_parse(
      context, &offline_pubkey_secp, offline_pubkey_data.data(),
      offline_pubkey_data.size());
  if (ret != 1) {
    warn(
        CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse offline_pubkey Error.({})",
        ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 offline_pubkey parse Error.");
  }

  std::vector<secp256k1_pubkey> online_pubkeys(online_keys.size());
  std::vector<secp256k1_pubkey> offline_pubkeys(offline_keys.size());
  for (size_t index = 0; index < online_pubkeys.size(); ++index) {
    const std::vector<uint8_t>& online_data = online_keys[index].GetBytes();
    ret = secp256k1_ec_pubkey_parse(
        context, &online_pubkeys[index], online_data.data(),
        online_data.size());
    if (ret != 1) {
      warn(
          CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse onlines[{}] Error.({})",
          index, ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 onlines pubkey parse Error.");
    }

    const std::vector<uint8_t>& offline_data = offline_keys[index].GetBytes();
    ret = secp256k1_ec_pubkey_parse(
        context, &offline_pubkeys[index], offline_data.data(),
        offline_data.size());
    if (ret != 1) {
      warn(
          CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse offlines[{}] Error.({})",
          index, ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 offlines pubkey parse Error.");
    }
  }

  secp256k1_whitelist_signature signature;
  ret = secp256k1_whitelist_sign(
      context, &signature, online_pubkeys.data(), offline_pubkeys.data(),
      online_pubkeys.size(), &offline_pubkey_secp,
      online_privkey.GetBytes().data(), tweak_sum.GetBytes().data(),
      whitelist_index, nullptr, nullptr);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_whitelist_sign Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 whitelist sign Error.");
  }

  ret = secp256k1_whitelist_verify(
      context, &signature, online_pubkeys.data(), offline_pubkeys.data(),
      online_pubkeys.size(), &offline_pubkey_secp);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_whitelist_verify Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist verify Error.");
  }

  std::vector<uint8_t> output(kOutputMaxSize);
  size_t output_size = 1 + (kPrivkeySize * (1 + online_pubkeys.size()));
  size_t outlen = output_size;
  ret = secp256k1_whitelist_signature_serialize(
      context, output.data(), &outlen, &signature);
  if (ret != 1) {
    warn(
        CFD_LOG_SOURCE, "secp256k1_whitelist_signature_serialize Error.({})",
        ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist signature serialize Error.");
  }
  if (outlen != output_size) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_whitelist_signature_serialize size Error.({})", outlen);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist signature serialize size Error.");
  }
  output.resize(output_size);
  return ByteData(output);
}